

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

void scrolling_group_invalid_proc
               (Am_Object *group,Am_Object *which_part,int left,int top,int width,int height)

{
  bool bVar1;
  int iVar2;
  Am_Wrapper *pAVar3;
  Am_Value *pAVar4;
  Am_Object local_90;
  Am_Object local_88;
  int local_80;
  int local_7c;
  int insidetop;
  int insideleft;
  Am_Object v_scroller;
  Am_Object h_scroller;
  int local_60;
  int final_height;
  int final_width;
  int final_top;
  int final_left;
  int my_height;
  int my_width;
  int my_top;
  int my_left;
  Am_Object local_38;
  Am_Object owner;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Object *which_part_local;
  Am_Object *group_local;
  
  owner.data._0_4_ = height;
  owner.data._4_4_ = width;
  Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)group);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
  if (pAVar3 != (Am_Wrapper *)0x0) {
    pAVar4 = Am_Object::Get(group,100,7);
    my_width = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(group,0x65,7);
    my_height = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(group,0x66,7);
    final_left = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(group,0x67,7);
    final_top = Am_Value::operator_cast_to_int(pAVar4);
    Am_Object::Get_Object(&v_scroller,(Am_Slot_Key)group,0x1c3);
    Am_Object::Get_Object((Am_Object *)&insidetop,(Am_Slot_Key)group,0x1c4);
    bVar1 = Am_Object::operator!=(which_part,&v_scroller);
    height_local = top;
    width_local = left;
    if ((bVar1) && (bVar1 = Am_Object::operator!=(which_part,(Am_Object *)&insidetop), bVar1)) {
      pAVar4 = Am_Object::Get(group,0x1bf,7);
      local_7c = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(group,0x1c0,7);
      local_80 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(group,0x1c1,7);
      final_left = Am_Value::operator_cast_to_int(pAVar4);
      pAVar4 = Am_Object::Get(group,0x1c2,7);
      final_top = Am_Value::operator_cast_to_int(pAVar4);
      my_width = my_width + local_7c;
      my_height = my_height + local_80;
      pAVar4 = Am_Object::Get(group,0x11d,7);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      width_local = left - iVar2;
      pAVar4 = Am_Object::Get(group,0x11e,7);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      height_local = top - iVar2;
    }
    Am_Invalid_Rectangle_Intersect
              (width_local,height_local,owner.data._4_4_,(int)owner.data,my_width,my_height,
               final_left,final_top,&final_width,&final_height,&local_60,
               (int *)((long)&h_scroller.data + 4));
    if ((0 < local_60) && (0 < h_scroller.data._4_4_)) {
      Am_Object::Am_Object(&local_88,&local_38);
      Am_Object::Am_Object(&local_90,group);
      Am_Invalidate(&local_88,&local_90,final_width,final_height,local_60,h_scroller.data._4_4_);
      Am_Object::~Am_Object(&local_90);
      Am_Object::~Am_Object(&local_88);
    }
    Am_Object::~Am_Object((Am_Object *)&insidetop);
    Am_Object::~Am_Object(&v_scroller);
  }
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Invalid_Method, void, scrolling_group_invalid,
                 (Am_Object group, Am_Object which_part, int left, int top,
                  int width, int height))
{
  Am_Object owner = group.Get_Owner(Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
  if (owner) {
    int my_left =
        group.Get(Am_LEFT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int my_top = group.Get(Am_TOP, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int my_width =
        group.Get(Am_WIDTH, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int my_height =
        group.Get(Am_HEIGHT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int final_left, final_top, final_width, final_height;
    Am_Object h_scroller = group.Get_Object(
        Am_H_SCROLLER, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    Am_Object v_scroller = group.Get_Object(
        Am_V_SCROLLER, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    // check if one of the scroll bars
    if (which_part != h_scroller && which_part != v_scroller) {
      // then transform based on offsets for the inside

      // adjust both the clip region and the object to be in my
      // parent's coordinate system
      int insideleft =
          group.Get(Am_CLIP_LEFT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      int insidetop =
          group.Get(Am_CLIP_TOP, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      my_width = group.Get(
          Am_CLIP_WIDTH,
          Am_NO_DEPENDENCY |
              Am_RETURN_ZERO_ON_ERROR); //just re-set the value directly
      my_height =
          group.Get(Am_CLIP_HEIGHT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);

      my_left += insideleft;
      my_top += insidetop;

      //now offset the area by the x and y offsets
      left -= (int)group.Get(Am_X_OFFSET,
                             Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      top -= (int)group.Get(Am_Y_OFFSET,
                            Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    } // done with inside scrolling part

    // now clip incoming rectangle to my rectangle
    Am_Invalid_Rectangle_Intersect(left, top, width, height, my_left, my_top,
                                   my_width, my_height, final_left, final_top,
                                   final_width, final_height);
    if ((final_width > 0) && (final_height > 0))
      Am_Invalidate(owner, group, final_left, final_top, final_width,
                    final_height);
  }
}